

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapidxml.hpp
# Opt level: O3

void __thiscall
rapidxml::xml_document<char>::parse_node_attributes<0>
          (xml_document<char> *this,char **text,xml_node<char> *node)

{
  byte bVar1;
  size_t sVar2;
  byte *pbVar3;
  xml_attribute<char> *attribute;
  undefined8 *puVar4;
  char *pcVar5;
  char *pcVar6;
  byte *pbVar7;
  byte *pbVar8;
  
  pbVar8 = (byte *)*text;
  if (internal::lookup_tables<0>::lookup_attribute_name[*pbVar8] != '\0') {
    do {
      *text = (char *)(pbVar8 + 1);
      pbVar3 = pbVar8;
      do {
        pbVar7 = pbVar3 + 1;
        pbVar3 = pbVar3 + 1;
      } while (internal::lookup_tables<0>::lookup_attribute_name[*pbVar7] != '\0');
      *text = (char *)pbVar3;
      attribute = (xml_attribute<char> *)
                  memory_pool<char>::allocate_aligned(&this->super_memory_pool<char>,0x38);
      (attribute->super_xml_base<char>).m_parent = (xml_node<char> *)0x0;
      (attribute->super_xml_base<char>).m_name = (char *)0x0;
      (attribute->super_xml_base<char>).m_value = (char *)0x0;
      pcVar5 = *text;
      (attribute->super_xml_base<char>).m_name = (char *)pbVar8;
      (attribute->super_xml_base<char>).m_name_size = (long)pcVar5 - (long)pbVar8;
      xml_node<char>::append_attribute(node,attribute);
      pbVar8 = (byte *)*text;
      do {
        pbVar3 = pbVar8;
        pbVar8 = pbVar3 + 1;
      } while (internal::lookup_tables<0>::lookup_whitespace[*pbVar3] != '\0');
      *text = (char *)pbVar3;
      if (*pbVar3 != 0x3d) {
        puVar4 = (undefined8 *)__cxa_allocate_exception(0x18);
        pcVar5 = *text;
        *puVar4 = &PTR__exception_00b4ccd0;
        pcVar6 = "expected =";
        goto LAB_009367ec;
      }
      *text = (char *)(pbVar3 + 1);
      pcVar5 = (attribute->super_xml_base<char>).m_name;
      sVar2 = (attribute->super_xml_base<char>).m_name_size;
      if (pcVar5 == (char *)0x0) {
        pcVar5 = &xml_base<char>::nullstr()::zero;
        sVar2 = 0;
      }
      pcVar5[sVar2] = '\0';
      pbVar8 = (byte *)*text;
      pbVar3 = pbVar8;
      do {
        pbVar7 = pbVar3;
        pbVar3 = pbVar7 + 1;
        pbVar8 = pbVar8 + 1;
      } while (internal::lookup_tables<0>::lookup_whitespace[*pbVar7] != '\0');
      *text = (char *)pbVar7;
      bVar1 = *pbVar7;
      if ((bVar1 != 0x22) && (bVar1 != 0x27)) {
LAB_009367cf:
        puVar4 = (undefined8 *)__cxa_allocate_exception(0x18);
        pcVar5 = *text;
        *puVar4 = &PTR__exception_00b4ccd0;
        pcVar6 = "expected \' or \"";
LAB_009367ec:
        puVar4[1] = pcVar6;
        puVar4[2] = pcVar5;
        __cxa_throw(puVar4,&parse_error::typeinfo,std::exception::~exception);
      }
      *text = (char *)pbVar3;
      if (bVar1 == 0x27) {
        pcVar5 = skip_and_expand_character_refs<rapidxml::xml_document<char>::attribute_value_pred<(char)39>,rapidxml::xml_document<char>::attribute_value_pure_pred<(char)39>,0>
                           (text);
      }
      else {
        pcVar5 = skip_and_expand_character_refs<rapidxml::xml_document<char>::attribute_value_pred<(char)34>,rapidxml::xml_document<char>::attribute_value_pure_pred<(char)34>,0>
                           (text);
      }
      (attribute->super_xml_base<char>).m_value = (char *)pbVar3;
      (attribute->super_xml_base<char>).m_value_size = (long)pcVar5 - (long)pbVar8;
      if (**text != bVar1) goto LAB_009367cf;
      *text = *text + 1;
      pcVar5 = (attribute->super_xml_base<char>).m_value;
      sVar2 = (attribute->super_xml_base<char>).m_value_size;
      if (pcVar5 == (char *)0x0) {
        pcVar5 = &xml_base<char>::nullstr()::zero;
        sVar2 = 0;
      }
      pcVar5[sVar2] = '\0';
      pbVar8 = (byte *)(*text + -1);
      do {
        pbVar3 = pbVar8 + 1;
        pbVar8 = pbVar8 + 1;
      } while (internal::lookup_tables<0>::lookup_whitespace[*pbVar3] != '\0');
      *text = (char *)pbVar8;
    } while (internal::lookup_tables<0>::lookup_attribute_name[*pbVar8] != '\0');
  }
  return;
}

Assistant:

void parse_node_attributes(Ch *&text, xml_node<Ch> *node)
        {
            // For all attributes 
            while (attribute_name_pred::test(*text))
            {
                // Extract attribute name
                Ch *name = text;
                ++text;     // Skip first character of attribute name
                skip<attribute_name_pred, Flags>(text);
                if (text == name)
                    RAPIDXML_PARSE_ERROR("expected attribute name", name);

                // Create new attribute
                xml_attribute<Ch> *attribute = this->allocate_attribute();
                attribute->name(name, text - name);
                node->append_attribute(attribute);

                // Skip whitespace after attribute name
                skip<whitespace_pred, Flags>(text);

                // Skip =
                if (*text != Ch('='))
                    RAPIDXML_PARSE_ERROR("expected =", text);
                ++text;

                // Add terminating zero after name
                if (!(Flags & parse_no_string_terminators))
                    attribute->name()[attribute->name_size()] = 0;

                // Skip whitespace after =
                skip<whitespace_pred, Flags>(text);

                // Skip quote and remember if it was ' or "
                Ch quote = *text;
                if (quote != Ch('\'') && quote != Ch('"'))
                    RAPIDXML_PARSE_ERROR("expected ' or \"", text);
                ++text;

                // Extract attribute value and expand char refs in it
                Ch *value = text, *end;
                const int AttFlags = Flags & ~parse_normalize_whitespace;   // No whitespace normalization in attributes
                if (quote == Ch('\''))
                    end = skip_and_expand_character_refs<attribute_value_pred<Ch('\'')>, attribute_value_pure_pred<Ch('\'')>, AttFlags>(text);
                else
                    end = skip_and_expand_character_refs<attribute_value_pred<Ch('"')>, attribute_value_pure_pred<Ch('"')>, AttFlags>(text);
                
                // Set attribute value
                attribute->value(value, end - value);
                
                // Make sure that end quote is present
                if (*text != quote)
                    RAPIDXML_PARSE_ERROR("expected ' or \"", text);
                ++text;     // Skip quote

                // Add terminating zero after value
                if (!(Flags & parse_no_string_terminators))
                    attribute->value()[attribute->value_size()] = 0;

                // Skip whitespace after attribute value
                skip<whitespace_pred, Flags>(text);
            }
        }